

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

void __thiscall
wasm::BufferWithRandomAccess::writeTo<std::ostream>
          (BufferWithRandomAccess *this,basic_ostream<char,_std::char_traits<char>_> *o)

{
  bool bVar1;
  reference puVar2;
  iterator iStack_30;
  uchar c;
  iterator __end2;
  iterator __begin2;
  BufferWithRandomAccess *__range2;
  basic_ostream<char,_std::char_traits<char>_> *o_local;
  BufferWithRandomAccess *this_local;
  
  __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  iStack_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end2);
    std::operator<<(o,*puVar2);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void writeTo(T& o) {
    for (auto c : *this) {
      o << c;
    }
  }